

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xdl.cpp
# Opt level: O2

String * __thiscall
asl::XdlEncoder::encode(String *__return_storage_ptr__,XdlEncoder *this,Var *v,Mode mode)

{
  byte bVar1;
  Mode MVar2;
  char *pcVar3;
  char *pcVar4;
  
  bVar1 = (byte)mode >> 3 & 1;
  MVar2 = mode & SIMPLE;
  pcVar3 = "%.7g";
  if (MVar2 == NONE) {
    pcVar3 = "%.9g";
  }
  pcVar4 = "%.17g";
  if (MVar2 != NONE) {
    pcVar4 = "%.15g";
  }
  if ((mode & SHORTF) != NONE) {
    pcVar4 = pcVar3;
  }
  this->_pretty = (bool)((byte)mode & 1);
  this->_json = (bool)bVar1;
  this->_simple = SUB41(MVar2 >> 1,0);
  this->_fmtF = pcVar3;
  this->_fmtD = pcVar4;
  if ((mode & PRETTY) != NONE) {
    String::operator=(&this->_sep1,", ");
    bVar1 = this->_json;
  }
  if (((bVar1 & 1) == 0) && (this->_pretty == true)) {
    String::operator=(&this->_sep2,"");
  }
  reset(this);
  _encode(this,v);
  if (this->_pretty == true) {
    String::operator+=(&this->_out,'\n');
  }
  (*this->_sink->_vptr_XdlSink[2])(this->_sink,this);
  String::String(__return_storage_ptr__,&this->_out);
  return __return_storage_ptr__;
}

Assistant:

String XdlEncoder::encode(const Var& v, Json::Mode mode)
{
	_pretty = (mode & Json::PRETTY) != 0;
	_json = (mode & Json::JSON) != 0;
	_simple = (mode & Json::SIMPLE) != 0;
	_fmtF = _simple ? "%.7g" : "%.9g";
	_fmtD = _simple ? "%.15g" : "%.17g";
	if (mode & Json::SHORTF)
		_fmtD = _fmtF;
	if (_pretty)
		_sep1 = ", ";
	if (!_json && _pretty)
		_sep2 = "";
	reset();
	_encode(v);
	if (_pretty)
		_out += '\n';
	_sink->write(_out);
	return data();
}